

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_Memset
               (Var instance,int32 start,Var value,int32 length,ScriptContext *scriptContext)

{
  code *pcVar1;
  long lVar2;
  undefined8 scriptContext_00;
  bool bVar3;
  BOOL BVar4;
  ThreadContext *threadContext;
  undefined4 *puVar5;
  RecyclableObject *this;
  TypedArray<char,_false,_false> *this_00;
  TypedArray<unsigned_char,_false,_false> *this_01;
  TypedArray<unsigned_char,_true,_false> *this_02;
  TypedArray<short,_false,_false> *this_03;
  TypedArray<unsigned_short,_false,_false> *this_04;
  TypedArray<int,_false,_false> *this_05;
  TypedArray<unsigned_int,_false,_false> *this_06;
  TypedArray<float,_false,_false> *this_07;
  TypedArray<double,_false,_false> *this_08;
  JavascriptArray *pJVar6;
  INT_PTR IVar7;
  double local_e0;
  double doubleValue;
  INT_PTR IStack_d0;
  int32 intValue;
  INT_PTR vt;
  TypedArrayType_conflict6 typedValue_8;
  uint local_b8;
  TypedArrayType_conflict5 typedValue_7;
  TypedArrayType_conflict4 typedValue_6;
  TypedArrayType_conflict3 typedValue_5;
  TypedArrayType_conflict2 typedValue_4;
  TypedArrayType_conflict1 typedValue_3;
  TypedArrayType_conflict typedValue_2;
  TypedArrayType_conflict typedValue_1;
  TypedArrayType typedValue;
  BOOL returnValue;
  TypeId local_98;
  undefined4 local_94;
  TypeId instanceType;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  int32 length_local;
  Var value_local;
  int32 start_local;
  Var instance_local;
  TypeId local_34;
  Var local_20;
  TypeId typeId;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&instanceType,threadContext);
  if (length < 1) {
    instance_local._4_4_ = 0;
    goto LAB_00f9b95b;
  }
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(instance);
  if (bVar3) {
    local_34 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(instance);
    if (bVar3) {
      local_34 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_34 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_34) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  local_98 = local_34;
  _typedValue_4 = 0;
  switch(local_34) {
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
    scriptContext_local._4_4_ = length;
    value_local._4_4_ = start;
    if (start < 0) {
      for (; scriptContext_00 = reentrancylock._24_8_,
          (int)value_local._4_4_ < 0 && 0 < (int)scriptContext_local._4_4_;
          value_local._4_4_ = value_local._4_4_ + 1) {
        bVar3 = TaggedInt::IsOverflow(value_local._4_4_);
        if (bVar3) {
          local_20 = JavascriptNumber::NewInlined
                               ((double)(int)value_local._4_4_,(ScriptContext *)scriptContext_00);
        }
        else {
          local_20 = TaggedInt::ToVarUnchecked(value_local._4_4_);
        }
        BVar4 = OP_SetElementI(instance,local_20,value,(ScriptContext *)reentrancylock._24_8_,
                               PropertyOperation_None);
        if (BVar4 == 0) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        scriptContext_local._4_4_ = scriptContext_local._4_4_ - 1;
      }
    }
    bVar3 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                      ((ScriptContextOptimizationOverrideInfo *)(reentrancylock._24_8_ + 0x40));
    if (bVar3) {
      IStack_d0 = VirtualTableInfoBase::GetVirtualTable(instance);
      if (local_98 == TypeIds_Array) {
        pJVar6 = UnsafeVarTo<Js::JavascriptArray>(instance);
        bVar3 = Js::JavascriptArray::DirectSetItemAtRange<void*>
                          (pJVar6,value_local._4_4_,scriptContext_local._4_4_,value);
      }
      else if (local_98 == TypeIds_NativeIntArray) {
        bVar3 = TaggedInt::Is(value);
        if (!bVar3) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        doubleValue._4_4_ = 0;
        bVar3 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                          (value,(ScriptContext *)reentrancylock._24_8_,
                           (int *)((long)&doubleValue + 4));
        if (!bVar3) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        bVar3 = SparseArraySegment<int>::IsMissingItem((int *)((long)&doubleValue + 4));
        if (bVar3) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        pJVar6 = UnsafeVarTo<Js::JavascriptArray>(instance);
        bVar3 = Js::JavascriptArray::DirectSetItemAtRange<int>
                          (pJVar6,value_local._4_4_,scriptContext_local._4_4_,doubleValue._4_4_);
      }
      else {
        bVar3 = JavascriptNumber::Is(value);
        if ((!bVar3) && (bVar3 = TaggedNumber::Is(value), !bVar3)) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        local_e0 = 0.0;
        bVar3 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                          (value,(ScriptContext *)reentrancylock._24_8_,&local_e0);
        if (!bVar3) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        bVar3 = SparseArraySegment<double>::IsMissingItem(&local_e0);
        if (bVar3) {
          instance_local._4_4_ = 0;
          goto LAB_00f9b95b;
        }
        pJVar6 = UnsafeVarTo<Js::JavascriptArray>(instance);
        bVar3 = Js::JavascriptArray::DirectSetItemAtRange<double>
                          (pJVar6,value_local._4_4_,scriptContext_local._4_4_,local_e0);
      }
      lVar2 = IStack_d0;
      _typedValue_4 = (uint)bVar3;
      IVar7 = VirtualTableInfoBase::GetVirtualTable(instance);
      _typedValue_4 = lVar2 == IVar7 & _typedValue_4;
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x14aa,"(false)","We don\'t support this type for memset yet.");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case TypeIds_Int8Array:
    typedValue_5._3_1_ = '\0';
    bVar3 = MemsetConversion<char,_&Js::JavascriptConversion::ToInt8>
                      (value,(ScriptContext *)reentrancylock._24_8_,
                       (char *)((long)&typedValue_5 + 3));
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_00 = VarTo<Js::TypedArray<char,false,false>>(instance);
    _typedValue_4 =
         TypedArray<char,_false,_false>::DirectSetItemAtRange
                   (this_00,start,length,typedValue_5._3_1_);
    break;
  case TypeIds_Uint8Array:
    typedValue_5._2_1_ = '\0';
    bVar3 = MemsetConversion<unsigned_char,_&Js::JavascriptConversion::ToUInt8>
                      (value,(ScriptContext *)reentrancylock._24_8_,
                       (uchar *)((long)&typedValue_5 + 2));
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_01 = VarTo<Js::TypedArray<unsigned_char,false,false>>(instance);
    _typedValue_4 =
         TypedArray<unsigned_char,_false,_false>::DirectSetItemAtRange
                   (this_01,start,length,typedValue_5._2_1_);
    break;
  case TypeIds_Uint8ClampedArray:
    typedValue_5._1_1_ = '\0';
    bVar3 = MemsetConversion<unsigned_char,_&Js::JavascriptConversion::ToUInt8Clamped>
                      (value,(ScriptContext *)reentrancylock._24_8_,
                       (uchar *)((long)&typedValue_5 + 1));
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_02 = VarTo<Js::TypedArray<unsigned_char,true,false>>(instance);
    _typedValue_4 =
         TypedArray<unsigned_char,_true,_false>::DirectSetItemAtRange
                   (this_02,start,length,typedValue_5._1_1_);
    break;
  case TypeIds_Int16Array:
    typedValue_6._2_2_ = 0;
    bVar3 = MemsetConversion<short,_&Js::JavascriptConversion::ToInt16>
                      (value,(ScriptContext *)reentrancylock._24_8_,
                       (short *)((long)&typedValue_6 + 2));
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_03 = VarTo<Js::TypedArray<short,false,false>>(instance);
    _typedValue_4 =
         TypedArray<short,_false,_false>::DirectSetItemAtRange
                   (this_03,start,length,typedValue_6._2_2_);
    break;
  case TypeIds_Uint16Array:
    typedValue_6._0_2_ = 0;
    bVar3 = MemsetConversion<unsigned_short,_&Js::JavascriptConversion::ToUInt16>
                      (value,(ScriptContext *)reentrancylock._24_8_,(unsigned_short *)&typedValue_6)
    ;
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_04 = VarTo<Js::TypedArray<unsigned_short,false,false>>(instance);
    _typedValue_4 =
         TypedArray<unsigned_short,_false,_false>::DirectSetItemAtRange
                   (this_04,start,length,(unsigned_short)typedValue_6);
    break;
  case TypeIds_Int32Array:
    typedValue_7 = 0.0;
    bVar3 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                      (value,(ScriptContext *)reentrancylock._24_8_,(int *)&typedValue_7);
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_05 = VarTo<Js::TypedArray<int,false,false>>(instance);
    _typedValue_4 =
         TypedArray<int,_false,_false>::DirectSetItemAtRange(this_05,start,length,(int)typedValue_7)
    ;
    break;
  case TypeIds_Uint32Array:
    local_b8 = 0;
    bVar3 = MemsetConversion<unsigned_int,_&Js::JavascriptConversion::ToUInt32>
                      (value,(ScriptContext *)reentrancylock._24_8_,&local_b8);
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_06 = VarTo<Js::TypedArray<unsigned_int,false,false>>(instance);
    _typedValue_4 =
         TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange(this_06,start,length,local_b8)
    ;
    break;
  case TypeIds_Float32Array:
    typedValue_8._4_4_ = 0.0;
    bVar3 = MemsetConversion<float,_&Js::JavascriptConversion::ToFloat>
                      (value,(ScriptContext *)reentrancylock._24_8_,
                       (float *)((long)&typedValue_8 + 4));
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_07 = VarTo<Js::TypedArray<float,false,false>>(instance);
    _typedValue_4 =
         TypedArray<float,_false,_false>::DirectSetItemAtRange
                   (this_07,start,length,typedValue_8._4_4_);
    break;
  case TypeIds_Float64Array:
    vt = 0;
    bVar3 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                      (value,(ScriptContext *)reentrancylock._24_8_,(double *)&vt);
    if (!bVar3) {
      instance_local._4_4_ = 0;
      goto LAB_00f9b95b;
    }
    this_08 = VarTo<Js::TypedArray<double,false,false>>(instance);
    _typedValue_4 =
         TypedArray<double,_false,_false>::DirectSetItemAtRange(this_08,start,length,(double)vt);
  }
  instance_local._4_4_ = _typedValue_4;
LAB_00f9b95b:
  local_94 = 1;
  JsReentLock::~JsReentLock((JsReentLock *)&instanceType);
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_Memset(Var instance, int32 start, Var value, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memset, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        BOOL  returnValue = false;

        // The typed array will deal with all possible values for the index
#define MEMSET_TYPED_ARRAY_CASE(type, conversion) \
        case TypeIds_##type: \
        { \
            type## ::TypedArrayType typedValue = 0; \
            if (!MemsetConversion<type## ::TypedArrayType, JavascriptConversion:: ##conversion>(value, scriptContext, &typedValue)) return false; \
            returnValue = VarTo< type## >(instance)->DirectSetItemAtRange(start, length, typedValue); \
            break; \
        }
        switch (instanceType)
        {
        MEMSET_TYPED_ARRAY_CASE(Int8Array, ToInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8Array, ToUInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8ClampedArray, ToUInt8Clamped)
        MEMSET_TYPED_ARRAY_CASE(Int16Array, ToInt16)
        MEMSET_TYPED_ARRAY_CASE(Uint16Array, ToUInt16)
        MEMSET_TYPED_ARRAY_CASE(Int32Array, ToInt32)
        MEMSET_TYPED_ARRAY_CASE(Uint32Array, ToUInt32)
        MEMSET_TYPED_ARRAY_CASE(Float32Array, ToFloat)
        MEMSET_TYPED_ARRAY_CASE(Float64Array, ToNumber)
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        case TypeIds_Array:
        {
            if (start < 0)
            {
                for (start; start < 0 && length > 0; ++start, --length)
                {
                    if (!OP_SetElementI(instance, JavascriptNumber::ToVar(start, scriptContext), value, scriptContext))
                    {
                        return false;
                    }
                }
            }
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(instance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<Var>(start, length, value);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    // Only accept tagged int.
                    if (!TaggedInt::Is(value))
                    {
                        return false;
                    }
                    int32 intValue = 0;
                    if (!MemsetConversion<int32, JavascriptConversion::ToInt32>(value, scriptContext, &intValue))
                    {
                        return false;
                    }
                     // Special case for missing item
                    if (SparseArraySegment<int32>::IsMissingItem(&intValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<int32>(start, length, intValue);
                }
                else
                {
                    // For native float arrays, the jit doesn't check the type of the source so we have to do it here
                    if (!JavascriptNumber::Is(value) && !TaggedNumber::Is(value))
                    {
                        return false;
                    }

                    double doubleValue = 0;
                    if (!MemsetConversion<double, JavascriptConversion::ToNumber>(value, scriptContext, &doubleValue))
                    {
                        return false;
                    }
                    // Special case for missing item
                    if (SparseArraySegment<double>::IsMissingItem(&doubleValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<double>(start, length, doubleValue);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(instance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memset yet.");
            break;
        }

#undef MEMSET_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memset);
    }